

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DefaultDistItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultDistItemSyntax,slang::parsing::Token&,slang::syntax::DistWeightSyntax*&>
          (BumpAllocator *this,Token *args,DistWeightSyntax **args_1)

{
  DistWeightSyntax *pDVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  DefaultDistItemSyntax *pDVar7;
  
  pDVar7 = (DefaultDistItemSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultDistItemSyntax *)this->endPtr < pDVar7 + 1) {
    pDVar7 = (DefaultDistItemSyntax *)allocateSlow(this,0x30,8);
  }
  else {
    this->head->current = (byte *)(pDVar7 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar2 = args->info;
  pDVar1 = *args_1;
  (pDVar7->super_DistItemBaseSyntax).super_SyntaxNode.kind = DefaultDistItem;
  (pDVar7->super_DistItemBaseSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar7->super_DistItemBaseSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pDVar7->defaultKeyword).kind = TVar3;
  (pDVar7->defaultKeyword).field_0x2 = uVar4;
  (pDVar7->defaultKeyword).numFlags = (NumericTokenFlags)NVar5.raw;
  (pDVar7->defaultKeyword).rawLen = uVar6;
  (pDVar7->defaultKeyword).info = pIVar2;
  pDVar7->weight = pDVar1;
  if (pDVar1 != (DistWeightSyntax *)0x0) {
    (pDVar1->super_SyntaxNode).parent = (SyntaxNode *)pDVar7;
  }
  return pDVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }